

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O2

color * __thiscall
image_texture::value(color *__return_storage_ptr__,image_texture *this,double u,double v,point3 *p)

{
  ushort uVar1;
  float *pfVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [13];
  undefined1 auVar5 [16];
  int iVar6;
  ushort *puVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  
  pfVar2 = (this->image).fdata;
  iVar6 = 0;
  if (pfVar2 != (float *)0x0) {
    iVar6 = (this->image).image_height;
  }
  if (iVar6 < 1) {
    dVar10 = 1.0;
    dVar8 = 0.0;
    dVar11 = 1.0;
  }
  else {
    dVar11 = 0.0;
    dVar8 = 1.0;
    if (v <= 1.0) {
      dVar8 = v;
    }
    dVar10 = 1.0;
    if (u <= 1.0) {
      dVar10 = u;
    }
    if (pfVar2 != (float *)0x0) {
      dVar11 = (double)(this->image).image_width;
    }
    puVar7 = (ushort *)
             rtw_image::pixel_data
                       (&this->image,(int)((double)(~-(ulong)(u < 0.0) & (ulong)dVar10) * dVar11),
                        (int)((double)(-(ulong)(v < 0.0) & 0x3ff0000000000000 |
                                      ~-(ulong)(v < 0.0) & (ulong)(1.0 - dVar8)) * (double)iVar6));
    uVar1 = *puVar7;
    auVar5._10_6_ = 0;
    auVar5._0_10_ = SUB1610(ZEXT116(0) << 0x40,6);
    auVar4[0xc] = 0;
    auVar4._0_12_ = SUB1612(auVar5 << 0x30,4);
    auVar9[2] = (char)(uVar1 >> 8);
    auVar9._0_2_ = uVar1;
    auVar9._3_13_ = auVar4 << 8;
    auVar3._2_10_ = (unkuint10)0 << 0x10;
    auVar3._0_2_ = auVar9._2_2_;
    dVar8 = (double)(uVar1 & 0xff) * 0.00392156862745098;
    dVar11 = (double)auVar3._0_4_ * 0.00392156862745098;
    dVar10 = (double)(byte)puVar7[1] * 0.00392156862745098;
  }
  __return_storage_ptr__->e[0] = dVar8;
  __return_storage_ptr__->e[1] = dVar11;
  __return_storage_ptr__->e[2] = dVar10;
  return __return_storage_ptr__;
}

Assistant:

color value(double u, double v, const point3& p) const override {
        // If we have no texture data, then return solid cyan as a debugging aid.
        if (image.height() <= 0) return color(0,1,1);

        // Clamp input texture coordinates to [0,1] x [1,0]
        u = interval(0,1).clamp(u);
        v = 1.0 - interval(0,1).clamp(v);  // Flip V to image coordinates

        auto i = int(u * image.width());
        auto j = int(v * image.height());
        auto pixel = image.pixel_data(i,j);

        auto color_scale = 1.0 / 255.0;
        return color(color_scale*pixel[0], color_scale*pixel[1], color_scale*pixel[2]);
    }